

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::FormatComment
          (string *__return_storage_ptr__,SourceLocationCommentPrinter *this,string *comment_text)

{
  pointer pcVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t in_R9;
  string_view format;
  string stripped_comment;
  const_iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_98;
  size_type local_68;
  pointer local_60;
  size_t local_58;
  char *pcStack_50;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar1 = (comment_text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + comment_text->_M_string_length);
  _Var5._M_p = local_b8._M_dataplus._M_p + local_b8._M_string_length;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var5._M_p;
  if (0 < (long)local_b8._M_string_length >> 2) {
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_b8._M_dataplus._M_p + ((uint)local_b8._M_string_length & 3));
    lVar3 = ((long)local_b8._M_string_length >> 2) + 1;
    do {
      in_R9 = (size_t)(byte)_Var5._M_p[-1];
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) goto LAB_00170440;
      in_R9 = (size_t)(byte)_Var5._M_p[-2];
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        _Var5._M_p = _Var5._M_p + -1;
        goto LAB_00170440;
      }
      in_R9 = (size_t)(byte)_Var5._M_p[-3];
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        _Var5._M_p = _Var5._M_p + -2;
        goto LAB_00170440;
      }
      in_R9 = (size_t)(byte)_Var5._M_p[-4];
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        _Var5._M_p = _Var5._M_p + -3;
        goto LAB_00170440;
      }
      _Var5._M_p = _Var5._M_p + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)paVar6 - (long)local_b8._M_dataplus._M_p;
  if (lVar3 != 1) {
    _Var5._M_p = (pointer)paVar6;
    if (lVar3 != 2) {
      _Var5._M_p = local_b8._M_dataplus._M_p;
      if ((lVar3 != 3) ||
         (_Var5._M_p = (pointer)paVar6,
         ((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)paVar6->_M_local_buf[-1]] & 8)
         == 0)) goto LAB_00170440;
      _Var5._M_p = paVar6->_M_local_buf + -1;
    }
    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)_Var5._M_p[-1]] & 8) == 0)
    goto LAB_00170440;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(_Var5._M_p + -1);
  }
  _Var5._M_p = (pointer)paVar6;
  if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)paVar6->_M_local_buf[-1]] & 8) !=
      0) {
    _Var5._M_p = local_b8._M_dataplus._M_p;
  }
LAB_00170440:
  uVar4 = (long)_Var5._M_p - (long)local_b8._M_dataplus._M_p;
  if (local_b8._M_string_length < uVar4) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
  }
  local_b8._M_dataplus._M_p[uVar4] = '\0';
  local_b8._M_string_length = uVar4;
  absl::lts_20250127::StripLeadingAsciiWhitespace(&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98.splitter_ = &local_48;
  local_48.text_._M_len = local_b8._M_string_length;
  local_48.text_._M_str = local_b8._M_dataplus._M_p;
  local_48.delimiter_.c_ = '\n';
  local_98.pos_ = 0;
  local_98.state_ = kInitState;
  local_98.curr_._M_len = 0;
  local_98.curr_._M_str = (char *)0x0;
  local_98.delimiter_.c_ = '\n';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_98.state_ = kEndState;
    local_98.pos_ = local_b8._M_string_length;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&local_98);
  }
  sVar2 = local_48.text_._M_len;
  while ((local_98.state_ != kEndState || (local_98.pos_ != sVar2))) {
    local_60 = (this->prefix_)._M_dataplus._M_p;
    local_68 = (this->prefix_)._M_string_length;
    local_58 = local_98.curr_._M_len;
    pcStack_50 = local_98.curr_._M_str;
    format._M_str = (char *)&local_68;
    format._M_len = (size_t)"$0// $1\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x8,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatComment(const std::string& comment_text) {
    std::string stripped_comment = comment_text;
    absl::StripAsciiWhitespace(&stripped_comment);
    std::string output;
    for (absl::string_view line : absl::StrSplit(stripped_comment, '\n')) {
      absl::SubstituteAndAppend(&output, "$0// $1\n", prefix_, line);
    }
    return output;
  }